

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::FGetsFunc::checkArguments
          (FGetsFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Diagnostic *diag;
  Type *pTVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,2,2);
  if (bVar2) {
    pTVar3 = ((*args->_M_ptr)->type).ptr;
    bVar2 = Type::canBeStringLike(pTVar3);
    if (bVar2) {
      bVar2 = Type::isIntegral((args->_M_ptr[1]->type).ptr);
      if (bVar2) {
        return pCVar1->integerType;
      }
      pTVar3 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[1]);
      return pTVar3;
    }
    diag = ASTContext::addDiag(context,(DiagCode)0x1b000b,(*args->_M_ptr)->sourceRange);
    ast::operator<<(diag,pTVar3);
  }
  return pCVar1->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 2))
            return comp.getErrorType();

        const Type& ft = *args[0]->type;
        if (!ft.canBeStringLike()) {
            context.addDiag(diag::InvalidStringArg, args[0]->sourceRange) << ft;
            return comp.getErrorType();
        }

        if (!args[1]->type->isIntegral())
            return badArg(context, *args[1]);

        return comp.getIntegerType();
    }